

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

s3wid_t dict_add_word(dict_t *d,char *word,s3cipid_t *p,int32 np)

{
  int iVar1;
  dictword_t *pdVar2;
  uint uVar3;
  int32 iVar4;
  char *key;
  void *pvVar5;
  dictword_t *pdVar6;
  s3cipid_t *__dest;
  void *val;
  int local_38 [2];
  
  iVar1 = d->n_word;
  if (iVar1 < d->max_words) {
    pdVar2 = d->word;
    pdVar6 = pdVar2 + iVar1;
    key = __ckd_salloc__(word,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                         ,0xb5);
    pdVar2[iVar1].word = key;
    pvVar5 = hash_table_enter(d->ht,key,(void *)(long)d->n_word);
    if (pvVar5 == (void *)(long)d->n_word) {
      if (np < 1 || p == (s3cipid_t *)0x0) {
        pdVar6->ciphone = (s3cipid_t *)0x0;
        np = 0;
      }
      else {
        __dest = (s3cipid_t *)
                 __ckd_malloc__((ulong)(uint)(np * 2),
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                                ,0xbf);
        pdVar6->ciphone = __dest;
        memcpy(__dest,p,(ulong)(uint)(np * 2));
      }
      pdVar6->pronlen = np;
      pdVar6->alt = -1;
      pdVar6->basewid = d->n_word;
      uVar3 = dict_word2basestr(word);
      if (0 < (int)uVar3) {
        iVar4 = hash_table_lookup(d->ht,word,(void **)local_38);
        word[uVar3] = '(';
        if (iVar4 < 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                  ,0xd2,"Missing base word for \'%s\'\n",word);
          exit(1);
        }
        pdVar6->basewid = local_38[0];
        pdVar2 = d->word;
        pdVar6->alt = pdVar2[local_38[0]].alt;
        pdVar2[local_38[0]].alt = d->n_word;
      }
      iVar1 = d->n_word;
      d->n_word = iVar1 + 1;
      return iVar1;
    }
    ckd_free(pdVar6->word);
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
            ,0xaa,"Dictionary max size (%d) exceeded; reallocate another entries %d \n",
            (ulong)(uint)d->max_words,0x1000);
    pdVar6 = (dictword_t *)
             __ckd_realloc__(d->word,(long)d->max_words * 0x20 + 0x20000,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                             ,0xae);
    d->word = pdVar6;
    d->max_words = d->max_words + 0x1000;
  }
  return -1;
}

Assistant:

s3wid_t
dict_add_word(dict_t * d, char *word, s3cipid_t * p, int32 np)
{
    int32 len;
    dictword_t *wordp;
    s3wid_t newwid;

    if (d->n_word >= d->max_words) {
        E_INFO
            ("Dictionary max size (%d) exceeded; reallocate another entries %d \n",
             d->max_words, DICT_INC_SZ);
        d->word =
            (dictword_t *) ckd_realloc(d->word,
                                       (d->max_words +
                                        DICT_INC_SZ) * sizeof(dictword_t));
        d->max_words = d->max_words + DICT_INC_SZ;

        return (BAD_S3WID);
    }

    wordp = d->word + d->n_word;
    wordp->word = (char *) ckd_salloc(word);    /* Freed in dict_free */

    /* Associate word string with d->n_word in hash table */
    if (hash_table_enter(d->ht, wordp->word, (void *)(long)d->n_word) != (void *)(long)d->n_word) {
        ckd_free(wordp->word);
        return (BAD_S3WID);
    }

    /* Fill in word entry, and set defaults */
    if (p && (np > 0)) {
        wordp->ciphone = (s3cipid_t *) ckd_malloc(np * sizeof(s3cipid_t));      /* Freed in dict_free */
        memcpy(wordp->ciphone, p, np * sizeof(s3cipid_t));
        wordp->pronlen = np;
    }
    else {
        wordp->ciphone = NULL;
        wordp->pronlen = 0;
    }
    wordp->alt = BAD_S3WID;
    wordp->basewid = d->n_word;

    /* Determine base/alt wids */
    if ((len = dict_word2basestr(word)) > 0) {
	void *val;
	s3wid_t w;

        /* Truncated to a baseword string; find its ID */
        if (hash_table_lookup(d->ht, word, &val) < 0) {
            word[len] = '(';    /* Get back the original word */
            E_FATAL("Missing base word for '%s'\n", word);
        }
        else
            word[len] = '(';    /* Get back the original word */

        /* Link into alt list */
	w = (s3wid_t)(long)val;
        wordp->basewid = w;
        wordp->alt = d->word[w].alt;
        d->word[w].alt = d->n_word;
    }

    newwid = d->n_word++;

    return (newwid);
}